

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

void write_config(void)

{
  FILE *pFVar1;
  nh_option_desc *pnVar2;
  fnchar uiconfname [256];
  fnchar filename [256];
  fnchar afStack_208 [256];
  fnchar local_108 [256];
  
  get_config_name(local_108,'\0');
  get_config_name(afStack_208,'\x01');
  pFVar1 = (FILE *)open_config_file(local_108);
  if (pFVar1 != (FILE *)0x0) {
    pnVar2 = (nh_option_desc *)nh_get_options(2);
    write_config_options((FILE_conflict *)pFVar1,pnVar2);
    pnVar2 = (nh_option_desc *)nh_get_options(0);
    write_config_options((FILE_conflict *)pFVar1,pnVar2);
    fclose(pFVar1);
  }
  pFVar1 = (FILE *)open_config_file(afStack_208);
  if (pFVar1 != (FILE *)0x0) {
    write_config_options((FILE_conflict *)pFVar1,curses_options);
    fclose(pFVar1);
  }
  return;
}

Assistant:

void write_config(void)
{
    FILE *fp;
    fnchar filename[BUFSZ];
    fnchar uiconfname[BUFSZ];
    
    get_config_name(filename, FALSE);
    get_config_name(uiconfname, TRUE);
    
    fp = open_config_file(filename);
    if (fp && should_write_config()) {
	write_config_options(fp, nh_get_options(GAME_OPTIONS));
	write_config_options(fp, nh_get_options(CURRENT_BIRTH_OPTIONS));
	fclose(fp);
    }
    
    fp = open_config_file(uiconfname);
    if (fp) {
	write_config_options(fp, curses_options);
	fclose(fp);
    }
}